

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

PosixZone * anon_unknown.dwarf_10b2b6d::PosixZone::parse(char **pos,char *end)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *in_RDX;
  undefined8 *in_RSI;
  PosixZone *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  int offset;
  char *zoneEnd;
  char *zoneBegin;
  char *nameEnd;
  char *nameBegin;
  QString name;
  QString *in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff53;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffff54;
  int iVar8;
  int in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  PosixZone *size;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  char *local_78;
  char *local_68;
  char *local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = (char *)*in_RSI;
  size = in_RDI;
  local_68 = local_60;
  if (*(char *)*in_RSI == '<') {
    local_60 = local_60 + 1;
    local_68 = local_60;
    while( true ) {
      bVar6 = false;
      if (local_68 < in_RDX) {
        bVar6 = *local_68 != '>';
      }
      if (!bVar6) break;
      local_68 = local_68 + 1;
    }
    *in_RSI = local_68 + 1;
    in_stack_ffffffffffffff5f = 0;
  }
  else {
    while( true ) {
      bVar6 = false;
      if (local_68 < in_RDX) {
        bVar6 = asciiIsLetter(*local_68);
      }
      if (bVar6 == false) break;
      local_68 = local_68 + 1;
    }
    *in_RSI = local_68;
    in_stack_ffffffffffffff5e = 0;
  }
  if ((long)local_68 - (long)local_60 < 3) {
    QString::QString((QString *)0x750caa);
    in_RDI->offset = -0x80000000;
  }
  else {
    pcVar2 = (char *)*in_RSI;
    local_78 = (char *)*in_RSI;
    if ((local_78 < in_RDX) && ((*local_78 == '+' || (*local_78 == '-')))) {
      local_78 = local_78 + 1;
    }
    while ((local_78 < in_RDX &&
           (pcVar5 = strchr("0123456789:",(int)*local_78), pcVar5 != (char *)0x0))) {
      local_78 = local_78 + 1;
    }
    QString::fromUtf8((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (qsizetype)size);
    if (pcVar2 < local_78) {
      iVar4 = parsePosixOffset((char *)CONCAT17(in_stack_ffffffffffffff5f,
                                                CONCAT16(in_stack_ffffffffffffff5e,
                                                         CONCAT24(in_stack_ffffffffffffff5c,
                                                                  in_stack_ffffffffffffff58))),
                               (char *)CONCAT44(in_stack_ffffffffffffff54,
                                                CONCAT13(in_stack_ffffffffffffff53,
                                                         CONCAT12(in_stack_ffffffffffffff52,
                                                                  in_stack_ffffffffffffff50))));
      in_stack_ffffffffffffff58 = iVar4;
    }
    else {
      iVar4 = -0x80000000;
    }
    *in_RSI = local_78;
    uVar7 = false;
    bVar6 = (bool)uVar7;
    iVar8 = iVar4;
    if (iVar4 != 0) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(in_stack_ffffffffffffff5e,
                                           CONCAT24(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58))),
                 CONCAT44(iVar4,(uint)CONCAT12(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50))
                );
      bVar3 = ::operator==((QString *)
                           CONCAT17(in_stack_ffffffffffffff5f,
                                    CONCAT16(in_stack_ffffffffffffff5e,
                                             CONCAT24(in_stack_ffffffffffffff5c,
                                                      in_stack_ffffffffffffff58))),
                           (QLatin1StringView *)
                           CONCAT44(iVar8,CONCAT13(uVar7,CONCAT12(in_stack_ffffffffffffff52,
                                                                  in_stack_ffffffffffffff50))));
      in_stack_ffffffffffffff52 = true;
      bVar6 = (bool)in_stack_ffffffffffffff52;
      if (!bVar3) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT17(in_stack_ffffffffffffff5f,
                                    CONCAT16(in_stack_ffffffffffffff5e,
                                             CONCAT24(in_stack_ffffffffffffff5c,
                                                      in_stack_ffffffffffffff58))),
                   CONCAT44(iVar8,CONCAT13(uVar7,CONCAT12(1,in_stack_ffffffffffffff50))));
        in_stack_ffffffffffffff52 =
             ::operator==((QString *)
                          CONCAT17(in_stack_ffffffffffffff5f,
                                   CONCAT16(in_stack_ffffffffffffff5e,
                                            CONCAT24(in_stack_ffffffffffffff5c,
                                                     in_stack_ffffffffffffff58))),
                          (QLatin1StringView *)
                          CONCAT44(iVar8,CONCAT13(uVar7,CONCAT12(in_stack_ffffffffffffff52,
                                                                 in_stack_ffffffffffffff50))));
        bVar6 = (bool)in_stack_ffffffffffffff52;
      }
    }
    if (bVar6 == false) {
      QString::QString((QString *)
                       CONCAT44(iVar8,(uint)CONCAT12(in_stack_ffffffffffffff52,
                                                     in_stack_ffffffffffffff50)),
                       in_stack_ffffffffffffff48);
      in_RDI->offset = iVar4;
    }
    else {
      QString::QString((QString *)0x750e7a);
      in_RDI->offset = -0x80000000;
    }
    QString::~QString((QString *)0x750ee4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return size;
}

Assistant:

PosixZone PosixZone::parse(const char *&pos, const char *end)
{
    static const char offsetChars[] = "0123456789:";

    const char *nameBegin = pos;
    const char *nameEnd;
    Q_ASSERT(pos < end);

    if (*pos == '<') {
        ++nameBegin;    // skip the '<'
        nameEnd = nameBegin;
        while (nameEnd < end && *nameEnd != '>') {
            // POSIX says only alphanumeric, but we allow anything
            ++nameEnd;
        }
        pos = nameEnd + 1;      // skip the '>'
    } else {
        nameEnd = nameBegin;
        while (nameEnd < end && asciiIsLetter(*nameEnd))
            ++nameEnd;
        pos = nameEnd;
    }
    if (nameEnd - nameBegin < 3)
        return {};  // name must be at least 3 characters long

    // zone offset, form [+-]hh:mm:ss
    const char *zoneBegin = pos;
    const char *zoneEnd = pos;
    if (zoneEnd < end && (zoneEnd[0] == '+' || zoneEnd[0] == '-'))
        ++zoneEnd;
    while (zoneEnd < end) {
        if (strchr(offsetChars, char(*zoneEnd)) == nullptr)
            break;
        ++zoneEnd;
    }

    QString name = QString::fromUtf8(nameBegin, nameEnd - nameBegin);
    const int offset = zoneEnd > zoneBegin ? parsePosixOffset(zoneBegin, zoneEnd) : InvalidOffset;
    pos = zoneEnd;
    // UTC+hh:mm:ss or GMT+hh:mm:ss should be read as offsets from UTC, not as a
    // POSIX rule naming a zone as UTC or GMT and specifying a non-zero offset.
    if (offset != 0 && (name =="UTC"_L1 || name == "GMT"_L1))
        return {};
    return {std::move(name), offset};
}